

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O2

int prolog0(PROLOG_STATE *state,int tok,char *ptr,char *end,ENCODING *enc)

{
  int iVar1;
  int iVar2;
  code *pcVar3;
  
  iVar1 = 0;
  pcVar3 = prolog1;
  iVar2 = 0;
  switch(tok) {
  case 0xb:
    iVar2 = 0x37;
    break;
  case 0xc:
    iVar2 = 1;
    break;
  case 0xd:
    iVar2 = 0x38;
    break;
  case 0xe:
    goto switchD_00600792_caseD_e;
  case 0xf:
    break;
  case 0x10:
    iVar2 = (*enc->nameMatchesAscii)(enc,ptr + (long)enc->minBytesPerChar * 2,end,"DOCTYPE");
    if (iVar2 == 0) {
LAB_006007d6:
      iVar2 = -1;
      goto LAB_006007d8;
    }
    pcVar3 = doctype0;
    iVar2 = 3;
    break;
  default:
    if (tok != 0x1d) goto LAB_006007d6;
    iVar2 = 2;
LAB_006007d8:
    pcVar3 = error;
  }
  iVar1 = iVar2;
  state->handler = pcVar3;
switchD_00600792_caseD_e:
  return iVar1;
}

Assistant:

static int PTRCALL
prolog0(PROLOG_STATE *state, int tok, const char *ptr, const char *end,
        const ENCODING *enc) {
  switch (tok) {
  case XML_TOK_PROLOG_S:
    state->handler = prolog1;
    return XML_ROLE_NONE;
  case XML_TOK_XML_DECL:
    state->handler = prolog1;
    return XML_ROLE_XML_DECL;
  case XML_TOK_PI:
    state->handler = prolog1;
    return XML_ROLE_PI;
  case XML_TOK_COMMENT:
    state->handler = prolog1;
    return XML_ROLE_COMMENT;
  case XML_TOK_BOM:
    return XML_ROLE_NONE;
  case XML_TOK_DECL_OPEN:
    if (! XmlNameMatchesAscii(enc, ptr + 2 * MIN_BYTES_PER_CHAR(enc), end,
                              KW_DOCTYPE))
      break;
    state->handler = doctype0;
    return XML_ROLE_DOCTYPE_NONE;
  case XML_TOK_INSTANCE_START:
    state->handler = error;
    return XML_ROLE_INSTANCE_START;
  }
  return common(state, tok);
}